

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void windowReturnOneRow(WindowCodeArg *p)

{
  byte bVar1;
  int p2;
  Parse *pParse;
  Window *pMWin;
  Vdbe *p_00;
  FuncDef *pFVar2;
  char *pcVar3;
  u8 uVar4;
  int iVar5;
  int iVar6;
  int reg;
  int iVar7;
  int iVar8;
  KeyInfo *pP4;
  int p1;
  int iVar9;
  int iVar10;
  Window *pWin;
  Window *pWVar11;
  int local_74;
  
  pParse = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  pWVar11 = pMWin;
  if (pMWin->regStartRowid == 0) {
    for (; pWVar11 != (Window *)0x0; pWVar11 = pWVar11->pNextWin) {
      pFVar2 = pWVar11->pWFunc;
      pcVar3 = pFVar2->zName;
      if (pcVar3 == "nth_value" || pcVar3 == "first_value") {
        iVar8 = pWVar11->csrApp;
        iVar10 = pParse->nLabel + -1;
        pParse->nLabel = iVar10;
        iVar5 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(p_00,0x4b,0,pWVar11->regResult);
        if (pFVar2->zName == "nth_value") {
          sqlite3VdbeAddOp3(p_00,0x5e,pMWin->iEphCsr,pWVar11->iArgCol + 1,iVar5);
          windowCheckValue(pParse,iVar5,2);
        }
        else {
          sqlite3VdbeAddOp2(p_00,0x47,1,iVar5);
        }
        sqlite3VdbeAddOp3(p_00,0x6b,iVar5,pWVar11->regApp,iVar5);
        sqlite3VdbeAddOp3(p_00,0x37,pWVar11->regApp + 1,iVar10,iVar5);
        sqlite3VdbeAddOp3(p_00,0x1e,iVar8,0,iVar5);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar8,pWVar11->iArgCol,pWVar11->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar10);
        if (iVar5 != 0) {
          bVar1 = pParse->nTempReg;
joined_r0x001902f8:
          if (bVar1 < 8) {
            pParse->nTempReg = bVar1 + 1;
            pParse->aTempReg[bVar1] = iVar5;
          }
        }
      }
      else if (pcVar3 == "lead" || pcVar3 == "lag") {
        iVar8 = ((pWVar11->pOwner->x).pList)->nExpr;
        iVar10 = pWVar11->csrApp;
        iVar6 = pParse->nLabel + -1;
        pParse->nLabel = iVar6;
        iVar5 = sqlite3GetTempReg(pParse);
        iVar7 = pMWin->iEphCsr;
        if (iVar8 < 3) {
          sqlite3VdbeAddOp2(p_00,0x4b,0,pWVar11->regResult);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x5e,iVar7,pWVar11->iArgCol + 2,pWVar11->regResult);
        }
        sqlite3VdbeAddOp2(p_00,0x87,iVar7,iVar5);
        pcVar3 = pFVar2->zName;
        if (iVar8 < 2) {
          sqlite3VdbeAddOp2(p_00,0x56,iVar5,((pcVar3 == "lead") - 1) + (uint)(pcVar3 == "lead"));
        }
        else {
          iVar8 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(p_00,0x5e,iVar7,pWVar11->iArgCol + 1,iVar8);
          sqlite3VdbeAddOp3(p_00,(pcVar3 != "lead") + 0x6b,iVar8,iVar5,iVar5);
          if (iVar8 != 0) {
            bVar1 = pParse->nTempReg;
            if ((ulong)bVar1 < 8) {
              pParse->nTempReg = bVar1 + 1;
              pParse->aTempReg[bVar1] = iVar8;
            }
          }
        }
        sqlite3VdbeAddOp3(p_00,0x1e,iVar10,iVar6,iVar5);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar10,pWVar11->iArgCol,pWVar11->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar6);
        if (iVar5 != 0) {
          bVar1 = pParse->nTempReg;
          goto joined_r0x001902f8;
        }
      }
    }
  }
  else {
    local_74 = 0;
    iVar8 = 0;
    if (pMWin->pOrderBy != (ExprList *)0x0) {
      iVar8 = pMWin->pOrderBy->nExpr;
    }
    iVar10 = pMWin->csrApp;
    iVar7 = pParse->nLabel;
    iVar9 = iVar7 + -2;
    pParse->nLabel = iVar9;
    iVar5 = sqlite3GetTempReg(pParse);
    iVar6 = sqlite3GetTempReg(pParse);
    reg = 0;
    if (iVar8 != 0) {
      local_74 = sqlite3GetTempRange(pParse,iVar8);
      reg = sqlite3GetTempRange(pParse,iVar8);
    }
    iVar7 = iVar7 + -1;
    sqlite3VdbeAddOp2(p_00,0x87,pMWin->iEphCsr,iVar5);
    windowReadPeerValues(p,pMWin->iEphCsr,local_74);
    for (; pWVar11 != (Window *)0x0; pWVar11 = pWVar11->pNextWin) {
      sqlite3VdbeAddOp2(p_00,0x4b,0,pWVar11->regAccum);
    }
    sqlite3VdbeAddOp3(p_00,0x17,iVar10,iVar9,pMWin->regStartRowid);
    p2 = p_00->nOp;
    sqlite3VdbeAddOp2(p_00,0x87,iVar10,iVar6);
    sqlite3VdbeAddOp3(p_00,0x37,pMWin->regEndRowid,iVar9,iVar6);
    uVar4 = pMWin->eExclude;
    if (uVar4 != 'C') {
      if (uVar4 == 'V') {
        sqlite3VdbeAddOp3(p_00,0x36,iVar5,iVar7,iVar6);
      }
      else {
        iVar9 = 0;
        if (pMWin->pOrderBy == (ExprList *)0x0) {
          pP4 = (KeyInfo *)0x0;
        }
        else {
          pP4 = sqlite3KeyInfoFromExprList(pParse,pMWin->pOrderBy,0,0);
          uVar4 = pMWin->eExclude;
        }
        if (uVar4 == '_') {
          iVar9 = sqlite3VdbeAddOp3(p_00,0x36,iVar5,0,iVar6);
        }
        if (pP4 == (KeyInfo *)0x0) {
          sqlite3VdbeAddOp2(p_00,9,0,iVar7);
        }
        else {
          windowReadPeerValues(p,iVar10,reg);
          sqlite3VdbeAddOp3(p_00,0x5a,reg,local_74,iVar8);
          sqlite3VdbeAppendP4(p_00,pP4,-8);
          p1 = p_00->nOp + 1;
          sqlite3VdbeAddOp3(p_00,0xe,p1,iVar7,p1);
        }
        if (iVar9 != 0) {
          sqlite3VdbeJumpHere(p_00,iVar9);
        }
      }
    }
    windowAggStep(p,pMWin,iVar10,0,p->regArg);
    sqlite3VdbeResolveLabel(p_00,iVar7);
    sqlite3VdbeAddOp2(p_00,0x27,iVar10,p2);
    sqlite3VdbeJumpHere(p_00,p2 + -1);
    sqlite3VdbeJumpHere(p_00,p2 + 1);
    if (iVar6 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = iVar6;
      }
    }
    if (iVar5 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = iVar5;
      }
    }
    if (iVar8 != 0) {
      sqlite3ReleaseTempRange(pParse,reg,iVar8);
      sqlite3ReleaseTempRange(pParse,local_74,iVar8);
    }
    windowAggFinal(p,1);
  }
  sqlite3VdbeAddOp2(p_00,10,p->regGosub,p->addrGosub);
  return;
}

Assistant:

static void windowReturnOneRow(WindowCodeArg *p){
  Window *pMWin = p->pMWin;
  Vdbe *v = p->pVdbe;

  if( pMWin->regStartRowid ){
    windowFullScan(p);
  }else{
    Parse *pParse = p->pParse;
    Window *pWin;

    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      FuncDef *pFunc = pWin->pWFunc;
      assert( ExprUseXList(pWin->pOwner) );
      if( pFunc->zName==nth_valueName
       || pFunc->zName==first_valueName
      ){
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);

        if( pFunc->zName==nth_valueName ){
          sqlite3VdbeAddOp3(v, OP_Column,pMWin->iEphCsr,pWin->iArgCol+1,tmpReg);
          windowCheckValue(pParse, tmpReg, 2);
        }else{
          sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
        }
        sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
        sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
        VdbeCoverageNeverNull(v);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
      else if( pFunc->zName==leadName || pFunc->zName==lagName ){
        int nArg = pWin->pOwner->x.pList->nExpr;
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        int iEph = pMWin->iEphCsr;

        if( nArg<3 ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
        }else{
          sqlite3VdbeAddOp3(v, OP_Column, iEph,pWin->iArgCol+2,pWin->regResult);
        }
        sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
        if( nArg<2 ){
          int val = (pFunc->zName==leadName ? 1 : -1);
          sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
        }else{
          int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
          int tmpReg2 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
          sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
          sqlite3ReleaseTempReg(pParse, tmpReg2);
        }

        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
        VdbeCoverage(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, p->regGosub, p->addrGosub);
}